

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_OpenAudio(SDL_AudioSpec *want,SDL_AudioSpec *obtained)

{
  Uint8 UVar1;
  Uint16 UVar2;
  int iVar3;
  int iVar4;
  SDL_bool SVar5;
  long lVar6;
  uint uVar7;
  SDL_AudioFormat SVar8;
  char *pcVar9;
  bool bVar10;
  
  iVar4 = -1;
  if ((((byte)InitializedSubsystems20 & 0x10) == 0) && (iVar3 = SDL_InitSubSystem(0x10), iVar3 < 0))
  {
    return -1;
  }
  if ((want != (SDL_AudioSpec *)0x0) && (want->callback == (SDL_AudioCallback)0x0)) {
    pcVar9 = "Callback can\'t be NULL";
LAB_00112dc9:
    iVar4 = (*SDL20_SetError)(pcVar9);
    return iVar4;
  }
  (*SDL20_LockAudio)();
  if (audio_cbdata == (AudioCallbackWrapperData *)0x0) {
    (*SDL20_UnlockAudio)();
  }
  else {
    SVar5 = audio_cbdata->app_callback_opened;
    (*SDL20_UnlockAudio)();
    if (SVar5 != SDL_FALSE) {
      pcVar9 = "Audio device already opened";
      goto LAB_00112dc9;
    }
  }
  if (want->format != 0) goto LAB_00112de4;
  pcVar9 = (*SDL20_getenv)("SDL_AUDIO_FORMAT");
  if (pcVar9 == (char *)0x0) {
LAB_00112dad:
    if (want->format != 0) goto LAB_00112de4;
    goto LAB_00112db5;
  }
  iVar3 = (*SDL20_strcmp)(pcVar9,"U8");
  if (iVar3 == 0) {
    SVar8 = 8;
  }
  else {
    iVar3 = (*SDL20_strcmp)(pcVar9,"S8");
    if (iVar3 == 0) {
      SVar8 = 0x8008;
    }
    else {
      iVar3 = (*SDL20_strcmp)(pcVar9,"U16");
      SVar8 = 0x10;
      if (iVar3 != 0) {
        iVar3 = (*SDL20_strcmp)(pcVar9,"S16");
        if (iVar3 == 0) {
LAB_00112db5:
          SVar8 = 0x8010;
        }
        else {
          iVar3 = (*SDL20_strcmp)(pcVar9,"U16LSB");
          if (iVar3 != 0) {
            iVar3 = (*SDL20_strcmp)(pcVar9,"S16LSB");
            if (iVar3 == 0) goto LAB_00112db5;
            iVar3 = (*SDL20_strcmp)(pcVar9,"U16MSB");
            if (iVar3 == 0) {
              SVar8 = 0x1010;
            }
            else {
              iVar3 = (*SDL20_strcmp)(pcVar9,"S16MSB");
              if (iVar3 == 0) {
                SVar8 = 0x9010;
              }
              else {
                iVar3 = (*SDL20_strcmp)(pcVar9,"U16SYS");
                if (iVar3 != 0) {
                  iVar3 = (*SDL20_strcmp)(pcVar9,"S16SYS");
                  SVar8 = 0x8010;
                  if (iVar3 != 0) goto LAB_00112dad;
                }
              }
            }
          }
        }
      }
    }
  }
  want->format = SVar8;
LAB_00112de4:
  if (want->freq == 0) {
    pcVar9 = (*SDL20_getenv)("SDL_AUDIO_FREQUENCY");
    if (pcVar9 == (char *)0x0) {
      iVar3 = want->freq;
    }
    else {
      lVar6 = (*SDL20_strtol)(pcVar9,(char **)0x0,10);
      iVar3 = (int)lVar6;
      want->freq = iVar3;
    }
    if (iVar3 == 0) {
      want->freq = 0x5622;
    }
    want->samples = 0;
  }
  if (want->channels == '\0') {
    pcVar9 = (*SDL20_getenv)("SDL_AUDIO_CHANNELS");
    if (pcVar9 == (char *)0x0) {
      UVar1 = want->channels;
    }
    else {
      lVar6 = (*SDL20_strtol)(pcVar9,(char **)0x0,10);
      UVar1 = (Uint8)lVar6;
      want->channels = UVar1;
    }
    if (UVar1 == '\0') {
      want->channels = '\x02';
    }
  }
  if (want->samples == 0) {
    pcVar9 = (*SDL20_getenv)("SDL_AUDIO_SAMPLES");
    if (pcVar9 == (char *)0x0) {
      UVar2 = want->samples;
    }
    else {
      lVar6 = (*SDL20_strtol)(pcVar9,(char **)0x0,10);
      UVar2 = (Uint16)lVar6;
      want->samples = UVar2;
    }
    if (UVar2 == 0) {
      uVar7 = 1;
      do {
        UVar2 = (Uint16)uVar7;
        bVar10 = uVar7 < (uint)((want->freq / 1000) * 0x2e);
        uVar7 = uVar7 * 2;
      } while (bVar10);
      want->samples = UVar2;
    }
  }
  SVar5 = OpenSDL2AudioDevice(want);
  if (SVar5 != SDL_FALSE) {
    if (obtained != (SDL_AudioSpec *)0x0) {
      (*SDL20_memcpy)(obtained,want,0x20);
    }
    (*SDL20_memcpy)(&audio_cbdata->app_callback_format,want,0x20);
    (*SDL20_AtomicSet)(&audio_callback_paused,1);
    SVar5 = ResetAudioStream(&audio_cbdata->app_callback_stream,&audio_cbdata->app_callback_format,
                             &audio_cbdata->device_format,want->format,want->channels,want->freq);
    if (SVar5 == SDL_FALSE) {
      (*SDL20_UnlockAudio)();
      CloseSDL2AudioDevice();
    }
    else {
      audio_cbdata->app_callback_opened = SDL_TRUE;
      (*SDL20_UnlockAudio)();
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

SDLCALL
SDL_OpenAudio(SDL_AudioSpec *want, SDL_AudioSpec *obtained)
{
    SDL_bool already_opened;

    /* SDL_OpenAudio() will init the subsystem for you if necessary, yuck. */
    if ((InitializedSubsystems20 & SDL_INIT_AUDIO) != SDL_INIT_AUDIO) {
        if (SDL_InitSubSystem(SDL12_INIT_AUDIO) < 0) {
            return -1;
        }
    }

    /* SDL2 uses a NULL callback to mean "we plan to use SDL_QueueAudio()" */
    if (want && (want->callback == NULL)) {
        return SDL20_SetError("Callback can't be NULL");
    }

    SDL20_LockAudio();
    already_opened = (audio_cbdata && audio_cbdata->app_callback_opened) ? SDL_TRUE : SDL_FALSE;
    SDL20_UnlockAudio();
    if (already_opened) {
        return SDL20_SetError("Audio device already opened");
    }

    if (!want->format) {
        const char *env = SDL20_getenv("SDL_AUDIO_FORMAT");  /* SDL 1.2 checks this. */
        if (env != NULL) {
            if      (SDL20_strcmp(env, "U8") == 0) { want->format = AUDIO_U8; }
            else if (SDL20_strcmp(env, "S8") == 0) { want->format = AUDIO_S8; }
            else if (SDL20_strcmp(env, "U16") == 0) { want->format = AUDIO_U16SYS; }
            else if (SDL20_strcmp(env, "S16") == 0) { want->format = AUDIO_S16SYS; }
            else if (SDL20_strcmp(env, "U16LSB") == 0) { want->format = AUDIO_U16LSB; }
            else if (SDL20_strcmp(env, "S16LSB") == 0) { want->format = AUDIO_S16LSB; }
            else if (SDL20_strcmp(env, "U16MSB") == 0) { want->format = AUDIO_U16MSB; }
            else if (SDL20_strcmp(env, "S16MSB") == 0) { want->format = AUDIO_S16MSB; }
            else if (SDL20_strcmp(env, "U16SYS") == 0) { want->format = AUDIO_U16SYS; }
            else if (SDL20_strcmp(env, "S16SYS") == 0) { want->format = AUDIO_S16SYS; }
        }
        if (!want->format) {
            want->format = AUDIO_S16SYS;
        }
    }

    if (!want->freq) {
        const char *env = SDL20_getenv("SDL_AUDIO_FREQUENCY");  /* SDL 1.2 checks this. */
        if (env != NULL) {
            want->freq = SDL20_atoi(env);
        }
        if (!want->freq) {
            want->freq = 22050;
        }
        want->samples = 0;
    }

    if (!want->channels) {
        const char *env = SDL20_getenv("SDL_AUDIO_CHANNELS");  /* SDL 1.2 checks this. */
        if (env != NULL) {
            want->channels = SDL20_atoi(env);
        }
        if (!want->channels) {
            want->channels = 2;
        }
    }

    if (!want->samples) {
        const char *env = SDL20_getenv("SDL_AUDIO_SAMPLES");  /* SDL 1.2 checks this. */
        if (env != NULL) {
            want->samples = SDL20_atoi(env);
        }
        if (!want->samples) {
            const Uint32 samp = (want->freq / 1000) * 46;  /* ~46 ms */
            Uint32 pow2 = 1;
            while (pow2 < samp) {
                pow2 <<= 1;
            }
            want->samples = pow2;
        }
    }

    /* the app always passes callback data through an SDL_AudioStream, since it
       has to share with the fake CD-ROM support. This also avoids the risk of
       getting an incompatible device configuration from SDL2. As such,
       the app always gets the format it requests. */
    if (!OpenSDL2AudioDevice(want)) {
        return -1;
    }

    /* Device is locked now, unconditionally. Set up some things. */

    if (obtained) {  /* the app always gets the format it requests */
        SDL20_memcpy(obtained, want, sizeof (SDL_AudioSpec));
    }

    SDL20_memcpy(&audio_cbdata->app_callback_format, want, sizeof (SDL_AudioSpec));
    SDL20_AtomicSet(&audio_callback_paused, SDL_TRUE);  /* app callback always starts paused after open. */

    SDL_assert(audio_cbdata->app_callback_stream == NULL);
    if (!ResetAudioStream(&audio_cbdata->app_callback_stream, &audio_cbdata->app_callback_format, &audio_cbdata->device_format, want->format, want->channels, want->freq)) {
        SDL20_UnlockAudio();  /* make sure CD audio doesn't hang if it's playing. */
        return CloseSDL2AudioDevice();  /* will stay open if CD audio is still playing, cleans up otherwise. */
    }

    audio_cbdata->app_callback_opened = SDL_TRUE;

    SDL20_UnlockAudio();  /* we're off and going. */

    return 0;
}